

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_deviation(lysp_ctx *ctx,lysp_stmt *stmt,lysp_deviation **deviations)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  lysp_deviation *str_p;
  char *pcVar3;
  char *pcVar4;
  ly_ctx *local_80;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ctx *local_60;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  lysp_deviation *dev;
  lysp_deviation **deviations_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  if (*deviations == (lysp_deviation *)0x0) {
    _ret___1 = (undefined8 *)malloc(0x30);
    if (_ret___1 == (undefined8 *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_68 = (ly_ctx *)0x0;
      }
      else {
        local_68 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_68,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_deviation");
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    (*deviations)[-1].exts = (lysp_ext_instance *)((long)&((*deviations)[-1].exts)->name + 1);
    _ret___1 = (undefined8 *)
               realloc(&(*deviations)[-1].exts,(long)(*deviations)[-1].exts * 0x28 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
      if (ctx == (lysp_ctx *)0x0) {
        local_60 = (ly_ctx *)0x0;
      }
      else {
        local_60 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_60,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_deviation");
      return LY_EMEM;
    }
  }
  *deviations = (lysp_deviation *)(_ret___1 + 1);
  str_p = *deviations + (long)((long)&(*deviations)[-1].exts[-1].exts + 7);
  memset(str_p,0,0x28);
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (ctx == (lysp_ctx *)0x0) {
      local_70 = (ly_ctx *)0x0;
    }
    else {
      local_70 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ctx_local._4_4_ = lydict_insert(local_70,stmt->arg,0,&str_p->nodeid);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
        lVar1 = _ret___3->kw;
        if (lVar1 == LY_STMT_DESCRIPTION) {
          LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->dsc,Y_STR_ARG,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_DEVIATE) {
          LVar2 = lysp_stmt_deviate(ctx,_ret___3,&str_p->deviates,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
          LVar2 = lysp_stmt_ext(ctx,_ret___3,stmt->kw,0,&str_p->exts);
        }
        else {
          if (lVar1 != LY_STMT_REFERENCE) {
            if (ctx == (lysp_ctx *)0x0) {
              local_80 = (ly_ctx *)0x0;
            }
            else {
              local_80 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar3 = lyplg_ext_stmt2str(_ret___3->kw);
            pcVar4 = lyplg_ext_stmt2str(LY_STMT_DEVIATION);
            ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,pcVar4);
            return LY_EVALID;
          }
          LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->ref,Y_STR_ARG,&str_p->exts);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_deviation(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_deviation **deviations)
{
    struct lysp_deviation *dev;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *deviations, dev, LY_EMEM);

    /* store nodeid */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &dev->nodeid));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &dev->dsc, Y_STR_ARG, &dev->exts));
            break;
        case LY_STMT_DEVIATE:
            LY_CHECK_RET(lysp_stmt_deviate(ctx, child, &dev->deviates, &dev->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &dev->ref, Y_STR_ARG, &dev->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &dev->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_DEVIATION));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}